

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.hpp
# Opt level: O2

void supermap::io::SerializeHelper<supermap::ByteArray<4096UL>,_void>::serialize
               (ByteArray<4096UL> *ar,ostream *os)

{
  IOException *this;
  string sStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::ostream::write((char *)os,
                      (long)(ar->data_)._M_t.
                            super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                            .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  if (*(int *)(os + *(long *)(*(long *)os + -0x18) + 0x20) == 0) {
    return;
  }
  this = (IOException *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&sStack_78,0x1000);
  std::operator+(&local_58,"Unsuccessful serialization, expected to write ",&sStack_78);
  std::operator+(&local_38,&local_58," bytes");
  supermap::IOException::IOException(this,(string *)&local_38);
  __cxa_throw(this,&IOException::typeinfo,std::logic_error::~logic_error);
}

Assistant:

static void serialize(const ByteArray<Len> &ar, std::ostream &os) {
        os.write(ar.getCharsPointer(), Len);
        if (!os.good()) {
            throw IOException("Unsuccessful serialization, expected to write " + std::to_string(Len) + " bytes");
        }
    }